

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O1

bool __thiscall google::protobuf::safe_strtob(protobuf *this,StringPiece str,bool *value)

{
  protobuf pVar1;
  byte bVar2;
  protobuf pVar3;
  uint uVar4;
  bool bVar5;
  undefined1 uVar6;
  LogMessage *pLVar7;
  char *pcVar8;
  int iVar9;
  long lVar10;
  StringPiece s1;
  StringPiece s1_00;
  StringPiece s1_01;
  StringPiece s1_02;
  StringPiece s2;
  StringPiece s2_00;
  StringPiece s2_01;
  StringPiece s2_02;
  LogFinisher local_61;
  LogMessage local_60;
  
  s1.length_ = str.ptr_;
  if ((undefined1 *)str.length_ == (undefined1 *)0x0) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_FATAL,
               "third_party/sentencepiece/third_party/protobuf-lite/strutil.cc",0x519);
    pLVar7 = internal::LogMessage::operator<<(&local_60,"CHECK failed: value != nullptr: ");
    pLVar7 = internal::LogMessage::operator<<(pLVar7,"nullptr output boolean given.");
    internal::LogFinisher::operator=(&local_61,pLVar7);
    internal::LogMessage::~LogMessage(&local_60);
  }
  switch(s1.length_) {
  case (char *)0x1:
switchD_001dc953_caseD_1:
    pcVar8 = (char *)0x0;
    do {
      pVar1 = this[(long)pcVar8];
      pVar3 = (protobuf)((char)pVar1 + 0x20);
      if (0x19 < (byte)((char)pVar1 + 0xbfU)) {
        pVar3 = pVar1;
      }
      bVar2 = pcVar8[0x259ad1];
      uVar4 = bVar2 + 0x20 & 0xff;
      if (0x19 < (byte)(bVar2 + 0xbf)) {
        uVar4 = (uint)bVar2;
      }
      iVar9 = (byte)pVar3 - uVar4;
      if (pVar3 != SUB41(uVar4,0)) goto LAB_001dc9b7;
      pcVar8 = pcVar8 + 1;
    } while (s1.length_ != pcVar8);
    iVar9 = 0;
LAB_001dc9b7:
    if (iVar9 == 0) goto LAB_001dcc92;
    if (s1.length_ == (char *)0x1) {
LAB_001dcae9:
      pcVar8 = (char *)0x0;
      do {
        pVar1 = this[(long)pcVar8];
        pVar3 = (protobuf)((char)pVar1 + 0x20);
        if (0x19 < (byte)((char)pVar1 + 0xbfU)) {
          pVar3 = pVar1;
        }
        bVar2 = pcVar8[0x346d3b];
        uVar4 = bVar2 + 0x20 & 0xff;
        if (0x19 < (byte)(bVar2 + 0xbf)) {
          uVar4 = (uint)bVar2;
        }
        iVar9 = (byte)pVar3 - uVar4;
        if (pVar3 != SUB41(uVar4,0)) goto LAB_001dcb4b;
        pcVar8 = pcVar8 + 1;
      } while (s1.length_ != pcVar8);
      iVar9 = 0;
LAB_001dcb4b:
      uVar6 = 1;
      if (iVar9 == 0) goto LAB_001dcc94;
      if (s1.length_ == (char *)0x5) goto switchD_001dc953_caseD_5;
      if (s1.length_ == (char *)0x1) {
        lVar10 = 0;
        do {
          pVar1 = this[lVar10];
          pVar3 = (protobuf)((char)pVar1 + 0x20);
          if (0x19 < (byte)((char)pVar1 + 0xbfU)) {
            pVar3 = pVar1;
          }
          bVar2 = "bpe_dropout should be between 0 and 1"[lVar10 + 0x24];
          uVar4 = bVar2 + 0x20 & 0xff;
          if (0x19 < (byte)(bVar2 + 0xbf)) {
            uVar4 = (uint)bVar2;
          }
          iVar9 = (byte)pVar3 - uVar4;
          if (pVar3 != SUB41(uVar4,0)) goto LAB_001dcbc9;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 1);
        iVar9 = 0;
LAB_001dcbc9:
        if (iVar9 == 0) goto LAB_001dcc94;
      }
    }
    else {
      if (s1.length_ == (char *)0x5) goto switchD_001dc953_caseD_5;
      if (s1.length_ == (char *)0x3) goto switchD_001dc953_caseD_3;
    }
    break;
  case (char *)0x3:
switchD_001dc953_caseD_3:
    pcVar8 = (char *)0x0;
    do {
      pVar1 = this[(long)pcVar8];
      pVar3 = (protobuf)((char)pVar1 + 0x20);
      if (0x19 < (byte)((char)pVar1 + 0xbfU)) {
        pVar3 = pVar1;
      }
      bVar2 = pcVar8[0x253bdd];
      uVar4 = bVar2 + 0x20 & 0xff;
      if (0x19 < (byte)(bVar2 + 0xbf)) {
        uVar4 = (uint)bVar2;
      }
      iVar9 = (byte)pVar3 - uVar4;
      if (pVar3 != SUB41(uVar4,0)) goto LAB_001dcacd;
      pcVar8 = pcVar8 + 1;
    } while (s1.length_ != pcVar8);
    iVar9 = 0;
LAB_001dcacd:
    if (iVar9 == 0) {
LAB_001dcc92:
      uVar6 = 1;
      goto LAB_001dcc94;
    }
    if (s1.length_ == (char *)0x5) goto switchD_001dc953_caseD_5;
    if (s1.length_ == (char *)0x1) goto LAB_001dcae9;
    break;
  case (char *)0x4:
    pcVar8 = (char *)0x0;
    do {
      pVar1 = this[(long)pcVar8];
      pVar3 = (protobuf)((char)pVar1 + 0x20);
      if (0x19 < (byte)((char)pVar1 + 0xbfU)) {
        pVar3 = pVar1;
      }
      bVar2 = pcVar8[0x348924];
      uVar4 = bVar2 + 0x20 & 0xff;
      if (0x19 < (byte)(bVar2 + 0xbf)) {
        uVar4 = (uint)bVar2;
      }
      iVar9 = (byte)pVar3 - uVar4;
      if (pVar3 != SUB41(uVar4,0)) goto LAB_001dca44;
      pcVar8 = pcVar8 + 1;
    } while (s1.length_ != pcVar8);
    iVar9 = 0;
LAB_001dca44:
    if (iVar9 == 0) goto LAB_001dcc92;
    if (s1.length_ == (char *)0x5) goto switchD_001dc953_caseD_5;
    if (s1.length_ == (char *)0x3) goto switchD_001dc953_caseD_3;
    if (s1.length_ == (char *)0x1) goto switchD_001dc953_caseD_1;
    break;
  case (char *)0x5:
switchD_001dc953_caseD_5:
    pcVar8 = (char *)0x0;
    do {
      pVar1 = this[(long)pcVar8];
      pVar3 = (protobuf)((char)pVar1 + 0x20);
      if (0x19 < (byte)((char)pVar1 + 0xbfU)) {
        pVar3 = pVar1;
      }
      bVar2 = pcVar8[0x2574a6];
      uVar4 = bVar2 + 0x20 & 0xff;
      if (0x19 < (byte)(bVar2 + 0xbf)) {
        uVar4 = (uint)bVar2;
      }
      iVar9 = (byte)pVar3 - uVar4;
      if (pVar3 != SUB41(uVar4,0)) goto LAB_001dcc39;
      pcVar8 = pcVar8 + 1;
    } while (s1.length_ != pcVar8);
    iVar9 = 0;
LAB_001dcc39:
    if (iVar9 != 0) break;
    goto LAB_001dcc8e;
  }
  s1.ptr_ = (char *)this;
  s2.length_ = 1;
  s2.ptr_ = "f";
  bVar5 = CaseEqual(s1,s2);
  if (((bVar5) ||
      (s1_00.length_ = (stringpiece_ssize_type)s1.length_, s1_00.ptr_ = (char *)this,
      s2_00.length_ = 2, s2_00.ptr_ = "no", bVar5 = CaseEqual(s1_00,s2_00), bVar5)) ||
     (s1_01.length_ = (stringpiece_ssize_type)s1.length_, s1_01.ptr_ = (char *)this,
     s2_01.length_ = 1, s2_01.ptr_ = "n", bVar5 = CaseEqual(s1_01,s2_01), bVar5)) {
LAB_001dcc8e:
    uVar6 = 0;
  }
  else {
    s1_02.length_ = (stringpiece_ssize_type)s1.length_;
    s1_02.ptr_ = (char *)this;
    s2_02.length_ = 1;
    s2_02.ptr_ = "0";
    bVar5 = CaseEqual(s1_02,s2_02);
    uVar6 = 0;
    if (!bVar5) {
      return false;
    }
  }
LAB_001dcc94:
  *(undefined1 *)str.length_ = uVar6;
  return true;
}

Assistant:

bool safe_strtob(StringPiece str, bool* value) {
  GOOGLE_CHECK(value != nullptr) << "nullptr output boolean given.";
  if (CaseEqual(str, "true") || CaseEqual(str, "t") ||
      CaseEqual(str, "yes") || CaseEqual(str, "y") ||
      CaseEqual(str, "1")) {
    *value = true;
    return true;
  }
  if (CaseEqual(str, "false") || CaseEqual(str, "f") ||
      CaseEqual(str, "no") || CaseEqual(str, "n") ||
      CaseEqual(str, "0")) {
    *value = false;
    return true;
  }
  return false;
}